

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O0

void spdlog::details::fmt_helper::pad_uint<unsigned_long>
               (unsigned_long n,uint width,memory_buf_t *dest)

{
  uint uVar1;
  uint in_ESI;
  char *zeroes;
  memory_buf_t *in_stack_00000008;
  uint digits;
  
  uVar1 = count_digits<unsigned_long>(0x14a1dc);
  if (uVar1 < in_ESI) {
    fmt::v6::internal::buffer<char>::append<char>
              ((buffer<char> *)dest,(char *)in_stack_00000008,zeroes);
  }
  append_int<unsigned_long>((unsigned_long)dest,in_stack_00000008);
  return;
}

Assistant:

inline void pad_uint(T n, unsigned int width, memory_buf_t &dest)
{
    static_assert(std::is_unsigned<T>::value, "pad_uint must get unsigned T");
    auto digits = count_digits(n);
    if (width > digits)
    {
        const char *zeroes = "0000000000000000000";
        dest.append(zeroes, zeroes + width - digits);
    }
    append_int(n, dest);
}